

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomConnection::write(DomConnection *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  DomConnectionHints *this_00;
  uint uVar2;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar3;
  long in_FS_OFFSET;
  QAnyStringView QVar4;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  aVar3._4_4_ = in_register_00000034;
  aVar3._0_4_ = __fd;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)((long)__buf + 0x10);
  if (lVar1 == 0) {
    local_40.d = (Data *)0x0;
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    local_58.size = 0;
    local_40.ptr = L"connection";
    local_40.size = 10;
  }
  else {
    QString::toLower_helper((QString *)&local_40);
  }
  QVar4.m_size = (size_t)local_40.ptr;
  QVar4.field_0.m_data = aVar3.m_data;
  QXmlStreamWriter::writeStartElement(QVar4);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  if (lVar1 == 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  uVar2 = this->m_children;
  if ((uVar2 & 1) != 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_40,L"sender",6);
    QVar9.field_0.m_data = (void *)(local_40.size | 0x8000000000000000);
    __n = (size_t)(this->m_sender).d.ptr;
    QVar5.m_size = (size_t)local_40.ptr;
    QVar5.field_0.m_data = aVar3.m_data;
    QVar9.m_size = __n;
    QXmlStreamWriter::writeTextElement(QVar5,QVar9);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    uVar2 = this->m_children;
  }
  if ((uVar2 & 2) != 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_40,L"signal",6);
    QVar10.field_0.m_data = (void *)(local_40.size | 0x8000000000000000);
    __n = (size_t)(this->m_signal).d.ptr;
    QVar6.m_size = (size_t)local_40.ptr;
    QVar6.field_0.m_data = aVar3.m_data;
    QVar10.m_size = __n;
    QXmlStreamWriter::writeTextElement(QVar6,QVar10);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    uVar2 = this->m_children;
  }
  if ((uVar2 & 4) != 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_40,L"receiver",8);
    QVar11.field_0.m_data = (void *)(local_40.size | 0x8000000000000000);
    __n = (size_t)(this->m_receiver).d.ptr;
    QVar7.m_size = (size_t)local_40.ptr;
    QVar7.field_0.m_data = aVar3.m_data;
    QVar11.m_size = __n;
    QXmlStreamWriter::writeTextElement(QVar7,QVar11);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    uVar2 = this->m_children;
  }
  if ((uVar2 & 8) != 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_40,L"slot",4);
    QVar12.field_0.m_data = (void *)(local_40.size | 0x8000000000000000);
    __n = (size_t)(this->m_slot).d.ptr;
    QVar8.m_size = (size_t)local_40.ptr;
    QVar8.field_0.m_data = aVar3.m_data;
    QVar12.m_size = __n;
    QXmlStreamWriter::writeTextElement(QVar8,QVar12);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    uVar2 = this->m_children;
  }
  if ((uVar2 & 0x10) != 0) {
    this_00 = this->m_hints;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_40,L"hints",5);
    DomConnectionHints::write(this_00,__fd,&local_40,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomConnection::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("connection") : tagName.toLower());

    if (m_children & Sender)
        writer.writeTextElement(u"sender"_s, m_sender);

    if (m_children & Signal)
        writer.writeTextElement(u"signal"_s, m_signal);

    if (m_children & Receiver)
        writer.writeTextElement(u"receiver"_s, m_receiver);

    if (m_children & Slot)
        writer.writeTextElement(u"slot"_s, m_slot);

    if (m_children & Hints)
        m_hints->write(writer, u"hints"_s);

    writer.writeEndElement();
}